

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void __thiscall serialize_tests::with_params_derived::test_method(with_params_derived *this)

{
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  char *local_d8;
  char *local_d0;
  ParamsWrapper<serialize_tests::DerivedAndBaseFormat,_serialize_tests::Derived> local_c8;
  undefined1 *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  DataStream stream;
  string local_68;
  Derived local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.m_derived_data._M_dataplus._M_p = (pointer)&local_48.m_derived_data.field_2;
  local_48.m_derived_data._M_string_length = 0;
  local_48.m_derived_data.field_2._M_local_buf[0] = '\0';
  local_48.super_Base.m_base_data = '\x0f';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&local_48.m_derived_data,"xY");
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stream.m_read_pos = 0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.m_params = (DerivedAndBaseFormat *)&RAW_LOWER;
  local_c8.m_object = &local_48;
  ParamsWrapper<serialize_tests::DerivedAndBaseFormat,_serialize_tests::Derived>::
  Serialize<DataStream>(&local_c8,&stream);
  local_c8.m_params = (DerivedAndBaseFormat *)&HEX_UPPER;
  local_c8.m_object = &local_48;
  ParamsWrapper<serialize_tests::DerivedAndBaseFormat,_serialize_tests::Derived>::
  Serialize<DataStream>(&local_c8,&stream);
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1f0;
  file.m_begin = (iterator)&local_98;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a8,msg);
  local_c8.m_object = (Derived *)((ulong)local_c8.m_object & 0xffffffffffffff00);
  local_c8.m_params = (DerivedAndBaseFormat *)&PTR__lazy_ostream_011480b0;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = "";
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_d0 = "";
  DataStream::str_abi_cxx11_(&local_68,&stream);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (&local_c8,&local_d8,0x1f0,1,2,&local_68,"stream.str()","\x0f\x02xy0f\x02XY",
             "\"\\x0F\\x02xy\" \"0f\\x02XY\"");
  std::__cxx11::string::~string((string *)&local_68);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
  std::__cxx11::string::~string((string *)&local_48.m_derived_data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(with_params_derived)
{
    Derived d;
    d.m_base_data = 0x0F;
    d.m_derived_data = "xY";

    DataStream stream;

    stream << RAW_LOWER(d);

    stream << HEX_UPPER(d);

    BOOST_CHECK_EQUAL(stream.str(), "\x0F\x02xy"
                                    "0f\x02XY");
}